

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

void Eigen::internal::gemv_selector<2,1,true>::
     run<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>const>,4>,Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>>>
               (GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_4>
                *prod,Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *dest,Scalar *alpha)

{
  double *pdVar1;
  ScalarWithConstIfNotLvalue *pSVar2;
  Index lhsStride;
  Scalar *lhs;
  Index cols;
  EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  *this;
  size_t size;
  Index rows;
  _LhsNested *p_Var3;
  _RhsNested *p_Var4;
  ulong uVar5;
  Scalar *pSVar6;
  Index IVar7;
  Scalar *pSVar8;
  Scalar SVar9;
  Scalar SVar10;
  double alpha_00;
  Scalar local_118;
  double *local_110;
  ScalarWithConstIfNotLvalue *local_108;
  Index local_100;
  Scalar *local_f8;
  Index local_f0;
  EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  *local_e8;
  double *local_e0;
  size_t local_d8;
  Index local_d0;
  double *local_c8;
  Scalar *local_c0;
  Scalar *local_b8;
  Scalar local_b0;
  double local_a8;
  BlockImpl_dense<Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,__1,_1,_true,_true>
  local_a0;
  undefined1 local_68 [8];
  aligned_stack_memory_handler<double> actualRhsPtr_stack_memory_destructor;
  RhsScalar *actualRhsPtr;
  gemv_static_vector_if<double,__1,__1,_false> static_rhs;
  ResScalar actualAlpha;
  type actualRhs;
  type actualLhs;
  Scalar *alpha_local;
  Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *dest_local;
  GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_4>
  *prod_local;
  
  pSVar8 = &local_118;
  p_Var3 = ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_4>,_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
           ::lhs(&prod->
                  super_ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_4>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                );
  actualRhs.m_matrix.m_matrix =
       (Nested)blas_traits<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::
               extract(p_Var3);
  p_Var4 = ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_4>,_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
           ::rhs(&prod->
                  super_ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_4>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                );
  actualAlpha = (ResScalar)
                blas_traits<Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
                ::extract(p_Var4);
  local_b0 = *alpha;
  p_Var3 = ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_4>,_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
           ::lhs(&prod->
                  super_ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_4>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                );
  SVar9 = blas_traits<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::
          extractScalarFactor(p_Var3);
  local_a8 = local_b0 * SVar9;
  p_Var4 = ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_4>,_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
           ::rhs(&prod->
                  super_ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_4>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                );
  SVar10 = blas_traits<Eigen::Transpose<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
           ::extractScalarFactor(p_Var4);
  alpha_00 = local_a8 * SVar10;
  uVar5 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
          ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)&actualAlpha);
  if (0x1fffffffffffffff < uVar5) {
    throw_std_bad_alloc();
  }
  pSVar6 = TransposeImpl<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Dense>
           ::data((TransposeImpl<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Dense>
                   *)&actualAlpha);
  if (pSVar6 == (Scalar *)0x0) {
    IVar7 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
            ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                    *)&actualAlpha);
    if ((ulong)(IVar7 * 8) < 0x20001) {
      IVar7 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                      *)&actualAlpha);
      pSVar8 = (Scalar *)((long)&local_118 - (IVar7 * 8 + 0xfU & 0xfffffffffffffff0));
      local_c0 = pSVar8;
    }
    else {
      IVar7 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                      *)&actualAlpha);
      local_c0 = (Scalar *)aligned_malloc(IVar7 << 3);
    }
    local_b8 = local_c0;
  }
  else {
    local_b8 = TransposeImpl<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Dense>
               ::data((TransposeImpl<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Dense>
                       *)&actualAlpha);
    pSVar8 = &local_118;
  }
  actualRhsPtr_stack_memory_destructor._16_8_ = local_b8;
  *(undefined8 *)((long)pSVar8 + -8) = 0x136e4b;
  pSVar6 = TransposeImpl<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Dense>
           ::data((TransposeImpl<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Dense>
                   *)&actualAlpha);
  if (pSVar6 == (Scalar *)0x0) {
    local_c8 = (double *)actualRhsPtr_stack_memory_destructor._16_8_;
  }
  else {
    local_c8 = (double *)0x0;
  }
  local_e0 = local_c8;
  local_e8 = (EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&actualAlpha;
  *(undefined8 *)((long)pSVar8 + -8) = 0x136e87;
  local_d8 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
             ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                     *)&actualAlpha);
  this = local_e8;
  *(undefined8 *)((long)pSVar8 + -8) = 0x136e9a;
  IVar7 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
          ::size(this);
  size = local_d8;
  pdVar1 = local_e0;
  *(undefined8 *)((long)pSVar8 + -8) = 0x136ec1;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_68,pdVar1,size,
             0x20000 < (ulong)(IVar7 << 3));
  *(undefined8 *)((long)pSVar8 + -8) = 0x136eca;
  local_d0 = Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                       ((Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&actualRhs);
  *(undefined8 *)((long)pSVar8 + -8) = 0x136edc;
  local_f0 = Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                       ((Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&actualRhs);
  *(undefined8 *)((long)pSVar8 + -8) = 0x136eee;
  local_f8 = TransposeImpl<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Dense>::data
                       ((TransposeImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Dense>
                         *)&actualRhs);
  *(undefined8 *)((long)pSVar8 + -8) = 0x136f00;
  local_100 = TransposeImpl<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Dense>::
              outerStride((TransposeImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Dense>
                           *)&actualRhs);
  local_110 = (double *)actualRhsPtr_stack_memory_destructor._16_8_;
  *(undefined8 *)((long)pSVar8 + -8) = 0x136f1d;
  local_108 = TransposeImpl<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_Eigen::Dense>::data
                        ((TransposeImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_Eigen::Dense> *)dest
                        );
  *(undefined8 *)((long)pSVar8 + -8) = 0x136f3a;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>::col
            ((ColXpr *)&local_a0,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *)dest,0);
  *(undefined8 *)((long)pSVar8 + -8) = 0x136f48;
  local_118 = (Scalar)BlockImpl_dense<Eigen::Transpose<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_-1,_1,_true,_true>
                      ::innerStride(&local_a0);
  rows = local_d0;
  cols = local_f0;
  lhs = local_f8;
  lhsStride = local_100;
  pSVar2 = local_108;
  pdVar1 = local_110;
  *(Scalar *)((long)pSVar8 + -8) = local_118;
  *(ScalarWithConstIfNotLvalue **)((long)pSVar8 + -0x10) = pSVar2;
  *(undefined8 *)((long)pSVar8 + -0x18) = 0x136fa0;
  general_matrix_vector_product<long,_double,_1,_false,_double,_false,_0>::run
            (rows,cols,lhs,lhsStride,pdVar1,1,*(ResScalar **)((long)pSVar8 + -0x10),
             *(long *)((long)pSVar8 + -8),alpha_00);
  *(undefined8 *)((long)pSVar8 + -8) = 0x136faf;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_68);
  return;
}

Assistant:

static void run(const ProductType& prod, Dest& dest, const typename ProductType::Scalar& alpha)
  {
    typedef typename ProductType::LhsScalar LhsScalar;
    typedef typename ProductType::RhsScalar RhsScalar;
    typedef typename ProductType::Scalar    ResScalar;
    typedef typename ProductType::Index Index;
    typedef typename ProductType::ActualLhsType ActualLhsType;
    typedef typename ProductType::ActualRhsType ActualRhsType;
    typedef typename ProductType::_ActualRhsType _ActualRhsType;
    typedef typename ProductType::LhsBlasTraits LhsBlasTraits;
    typedef typename ProductType::RhsBlasTraits RhsBlasTraits;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(prod.lhs());
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(prod.rhs());

    ResScalar actualAlpha = alpha * LhsBlasTraits::extractScalarFactor(prod.lhs())
                                  * RhsBlasTraits::extractScalarFactor(prod.rhs());

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      DirectlyUseRhs = _ActualRhsType::InnerStrideAtCompileTime==1
    };

    gemv_static_vector_if<RhsScalar,_ActualRhsType::SizeAtCompileTime,_ActualRhsType::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      int size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename _ActualRhsType::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    general_matrix_vector_product
      <Index,LhsScalar,RowMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        actualLhs.data(), actualLhs.outerStride(),
        actualRhsPtr, 1,
        dest.data(), dest.col(0).innerStride(), //NOTE  if dest is not a vector at compile-time, then dest.innerStride() might be wrong. (bug 1166)
        actualAlpha);
  }